

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O0

void node::fill_kr_ancestors
               (vector<int,_std::allocator<int>_> *postl_to_kr_ancestor,
               vector<int,_std::allocator<int>_> *postl_to_lch,
               vector<int,_std::allocator<int>_> *list_kr)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  reference pvVar4;
  const_reference pvVar5;
  int local_40;
  int l;
  int i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *list_kr_local;
  vector<int,_std::allocator<int>_> *postl_to_lch_local;
  vector<int,_std::allocator<int>_> *postl_to_kr_ancestor_local;
  
  __end1 = std::vector<int,_std::allocator<int>_>::begin(list_kr);
  _l = std::vector<int,_std::allocator<int>_>::end(list_kr);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&l);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    iVar1 = *piVar3;
    local_40 = iVar1;
    while (-1 < local_40) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (postl_to_kr_ancestor,(long)local_40);
      *pvVar4 = iVar1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](postl_to_lch,(long)local_40);
      local_40 = *pvVar5;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void fill_kr_ancestors(std::vector<int>& postl_to_kr_ancestor,
    const std::vector<int>& postl_to_lch, const std::vector<int>& list_kr) {
  for (auto i : list_kr) {
    int l = i;
    while (l >= 0) {
      postl_to_kr_ancestor[l] = i;
      l = postl_to_lch[l];
    }
  }
}